

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AttachmentPromiseNode<capnp::LocalClient::BlockingScope>::~AttachmentPromiseNode
          (AttachmentPromiseNode<capnp::LocalClient::BlockingScope> *this)

{
  AttachmentPromiseNode<capnp::LocalClient::BlockingScope> *this_local;
  
  AttachmentPromiseNodeBase::dropDependency(&this->super_AttachmentPromiseNodeBase);
  ::capnp::LocalClient::BlockingScope::~BlockingScope(&this->attachment);
  AttachmentPromiseNodeBase::~AttachmentPromiseNodeBase(&this->super_AttachmentPromiseNodeBase);
  return;
}

Assistant:

~AttachmentPromiseNode() noexcept(false) {
    // We need to make sure the dependency is deleted before we delete the attachment because the
    // dependency may be using the attachment.
    dropDependency();
  }